

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * BinarySource_get_mp_ssh1(BinarySource *src)

{
  uint uVar1;
  size_t sVar2;
  ptrlen bytes_00;
  BinarySource *local_38;
  mp_int *toret;
  ptrlen bytes;
  uint bitc;
  BinarySource *src_local;
  
  uVar1 = BinarySource_get_uint16(src->binarysource_);
  bytes_00 = BinarySource_get_data(src->binarysource_,(ulong)(uVar1 + 7 >> 3));
  if (src->binarysource_->err == BSE_NO_ERROR) {
    local_38 = (BinarySource *)mp_from_bytes_be(bytes_00);
    sVar2 = mp_get_nbits((mp_int *)local_38);
    if (uVar1 < sVar2) {
      src->err = BSE_INVALID;
      mp_free((mp_int *)local_38);
      local_38 = (BinarySource *)mp_from_integer(0);
    }
    src_local = local_38;
  }
  else {
    src_local = (BinarySource *)mp_from_integer(0);
  }
  return (mp_int *)src_local;
}

Assistant:

mp_int *BinarySource_get_mp_ssh1(BinarySource *src)
{
    unsigned bitc = get_uint16(src);
    ptrlen bytes = get_data(src, (bitc + 7) / 8);
    if (get_err(src)) {
        return mp_from_integer(0);
    } else {
        mp_int *toret = mp_from_bytes_be(bytes);
        /* SSH-1.5 spec says that it's OK for the prefix uint16 to be
         * _greater_ than the actual number of bits */
        if (mp_get_nbits(toret) > bitc) {
            src->err = BSE_INVALID;
            mp_free(toret);
            toret = mp_from_integer(0);
        }
        return toret;
    }
}